

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O3

float __thiscall SVGChart::LogTrafo::Transform(LogTrafo *this,float inValue)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar2 = 1e-10;
  if (1e-10 <= inValue) {
    fVar2 = inValue;
  }
  fVar3 = this->mBase;
  fVar1 = this->mFactor;
  fVar2 = log10f(fVar2);
  fVar3 = log10f(fVar3);
  return ((fVar2 * fVar1) / fVar3) * this->mSlope + this->mOffset;
}

Assistant:

float LogTrafo::Transform (float inValue) const{
      if (inValue<kLogMinClipValue) {
        inValue = kLogMinClipValue;
      }
      return SafeLog (inValue, mBase, mFactor)*mSlope+mOffset;
    }